

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O3

XMLElementDecl * __thiscall
xercesc_4_0::SchemaGrammar::putElemDecl
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *prefixName,XMLCh *param_4,
          uint scope,bool notDeclared)

{
  SchemaElementDecl *this_00;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *this_01;
  XMLSize_t XVar1;
  
  this_00 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (this_00,prefixName,baseName,uriId,Any,0xfffffffe,this->fMemoryManager);
  if (notDeclared) {
    this_01 = this->fElemNonDeclPool;
    if (this_01 ==
        (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
      this_01 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x40,this->fMemoryManager);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(this_01,0x1d,true,0x80,this->fMemoryManager);
      this->fElemNonDeclPool = this_01;
    }
  }
  else {
    this_01 = this->fElemDeclPool;
  }
  XVar1 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                    (this_01,((this_00->super_XMLElementDecl).fElementName)->fLocalPart,uriId,scope,
                     this_00);
  (this_00->super_XMLElementDecl).fId = XVar1;
  return &this_00->super_XMLElementDecl;
}

Assistant:

XMLElementDecl* SchemaGrammar::putElemDecl (const   unsigned int    uriId
        , const XMLCh* const    baseName
        , const XMLCh* const    prefixName
        , const XMLCh* const
        , unsigned int          scope
        , const bool            notDeclared)
{
    SchemaElementDecl* retVal = new (fMemoryManager) SchemaElementDecl
    (
        prefixName
        , baseName
        , uriId
        , SchemaElementDecl::Any
        , Grammar::TOP_LEVEL_SCOPE
        , fMemoryManager
    );
    if(notDeclared)
    {
        if(!fElemNonDeclPool)
            fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        retVal->setId(fElemNonDeclPool->put((void*)retVal->getBaseName(), uriId, scope, retVal));
    } else
    {
        retVal->setId(fElemDeclPool->put((void*)retVal->getBaseName(), uriId, scope, retVal));
    }
    return retVal;
}